

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O3

Vector * __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::getFlexibilityVector
          (FixedContactEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  Vector *this_01;
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  DstEvaluatorType dstEvaluator;
  TimeSize TVar9;
  Vector *pVVar10;
  undefined1 (*__ptr) [16];
  TimeIndex k;
  undefined8 *puVar11;
  Index index;
  ulong uVar12;
  Index index_1;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Index size;
  double *pdVar16;
  undefined1 auVar17 [16];
  
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  TVar9 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
  if (TVar9 < 1) goto LAB_0014e188;
  pVVar10 = EKFFlexibilityEstimatorBase::getFlexibilityVector
                      (&this->super_EKFFlexibilityEstimatorBase);
  this_01 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
  pdVar16 = (pVVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar14 = (pVVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar14) {
    if ((long)uVar14 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_01,uVar14,uVar14,1);
    if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar14) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar12 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar14) {
    lVar13 = 0;
    do {
      pdVar2 = pdVar16 + lVar13;
      dVar3 = pdVar2[1];
      pdVar1 = pdVar4 + lVar13;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar3;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar12);
  }
  if ((long)uVar12 < (long)uVar14) {
    do {
      pdVar4[uVar12] = pdVar16[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
  }
  if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 6) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar16 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  dVar7 = *(double *)*(undefined1 (*) [16])(pdVar16 + 3);
  dVar8 = pdVar16[4];
  auVar5 = *(undefined1 (*) [16])(pdVar16 + 3);
  dVar3 = pdVar16[5];
  dVar6 = dVar3 * dVar3 + dVar8 * dVar8 + dVar7 * dVar7;
  if (dVar6 <= 22.206609902451056) {
    __ptr = (undefined1 (*) [16])malloc(0x18);
    if (((ulong)__ptr & 0xf) != 0) goto LAB_0014e1bf;
    if (__ptr == (undefined1 (*) [16])0x0) goto LAB_0014e1de;
    *(double *)*__ptr = dVar7;
    *(double *)(*__ptr + 8) = dVar8;
    *(double *)__ptr[1] = dVar3;
  }
  else {
    dVar6 = SQRT(dVar6);
    dVar7 = ceil((dVar6 + -3.141592653589793) / 6.283185307179586);
    __ptr = (undefined1 (*) [16])malloc(0x18);
    if (((ulong)__ptr & 0xf) != 0) {
LAB_0014e1bf:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (__ptr == (undefined1 (*) [16])0x0) {
LAB_0014e1de:
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = operator_delete;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    dVar7 = (double)(uint)((int)(long)dVar7 * 2) * -3.141592653589793 + dVar6;
    auVar17._8_8_ = dVar6;
    auVar17._0_8_ = dVar6;
    auVar17 = divpd(auVar5,auVar17);
    dVar8 = dVar7 * auVar17._8_8_;
    auVar5._8_4_ = SUB84(dVar8,0);
    auVar5._0_8_ = dVar7 * auVar17._0_8_;
    auVar5._12_4_ = (int)((ulong)dVar8 >> 0x20);
    *__ptr = auVar5;
    *(double *)__ptr[1] = (dVar3 / dVar6) * dVar7;
  }
  pdVar16 = pdVar16 + 3;
  uVar14 = 3;
  if (((ulong)pdVar16 & 7) == 0) {
    uVar14 = (ulong)((uint)((ulong)pdVar16 >> 3) & 1);
  }
  uVar12 = uVar14 + (ulong)(1 < (uVar14 ^ 3)) * 2;
  if (uVar14 == 0) {
LAB_0014e13d:
    do {
      dVar3 = *(double *)((long)(*__ptr + uVar14 * 8) + 8);
      pdVar16[uVar14] = *(double *)(*__ptr + uVar14 * 8);
      (pdVar16 + uVar14)[1] = dVar3;
      uVar14 = uVar14 + 2;
    } while (uVar14 < uVar12);
  }
  else {
    uVar15 = 0;
    do {
      pdVar16[uVar15] = *(double *)(*__ptr + uVar15 * 8);
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
    if (1 < (uint)(uVar14 ^ 3)) goto LAB_0014e13d;
  }
  if ((uint)uVar12 < 3) {
    do {
      pdVar16[uVar12] = *(double *)(*__ptr + uVar12 * 8);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
  }
  free(__ptr);
  k = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,this_01,k);
LAB_0014e188:
  return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
}

Assistant:

const Vector & FixedContactEKFFlexEstimatorIMU::getFlexibilityVector()
{
  if(ekf_.getMeasurementsNumber() > 0)
  {
    lastX_ = EKFFlexibilityEstimatorBase::getFlexibilityVector();

    /// regulate the part of orientation vector in the state vector
    lastX_.segment(indexes::ori, 3) = kine::regulateOrientationVector(lastX_.segment(indexes::ori, 3));

    ekf_.setState(lastX_, ekf_.getCurrentTime());
  }
  return lastX_;
}